

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O2

void Omega_h::print_histogram(Histogram *histogram,string *name)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  ios saved_state;
  
  std::ios::ios((ios *)&saved_state,(streambuf *)0x0);
  std::ios::copyfmt(&saved_state);
  lVar2 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar2 + -0x18)) = 2;
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::operator<<(poVar3," histogram:\n");
  uVar6 = (ulong)((long)(histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar5 = (int)uVar6;
  dVar7 = (histogram->max - histogram->min) / (double)iVar5;
  uVar4 = 0;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar5 < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = histogram->min;
    poVar3 = std::ostream::_M_insert<double>((double)(int)uVar4 * dVar7 + dVar1);
    std::operator<<(poVar3,'-');
    poVar3 = std::ostream::_M_insert<double>((double)((int)uVar4 + 1) * dVar7 + dVar1);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,'\n');
  }
  std::ios::copyfmt((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::ios_base::~ios_base((ios_base *)&saved_state);
  return;
}

Assistant:

void print_histogram(Histogram const& histogram, std::string const& name) {
  std::ios saved_state(nullptr);
  saved_state.copyfmt(std::cout);
  std::cout << std::fixed << std::setprecision(2);
  std::cout << name << " histogram:\n";
  auto nbins = Int(histogram.bins.size());
  auto interval = (histogram.max - histogram.min) / Real(nbins);
  for (Int i = 0; i < nbins; ++i) {
    auto floor = interval * i + histogram.min;
    auto ceil = interval * (i + 1) + histogram.min;
    std::cout << floor << '-' << ceil << ": " << histogram.bins[std::size_t(i)]
              << '\n';
  }
  std::cout.copyfmt(saved_state);
}